

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

FILE * testing::internal::OpenFileForWriting(string *output_file)

{
  pointer pcVar1;
  bool bVar2;
  FILE *pFVar3;
  ostream *poVar4;
  FilePath output_file_path;
  FilePath output_dir;
  GTestLog local_6c;
  long *local_68 [2];
  long local_58 [2];
  FilePath local_48;
  
  pcVar1 = (output_file->_M_dataplus)._M_p;
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + output_file->_M_string_length);
  FilePath::Normalize((FilePath *)local_68);
  FilePath::RemoveFileName(&local_48,(FilePath *)local_68);
  bVar2 = FilePath::CreateDirectoriesRecursively(&local_48);
  if (bVar2) {
    pFVar3 = fopen((output_file->_M_dataplus)._M_p,"w");
  }
  else {
    pFVar3 = (FILE *)0x0;
  }
  if (pFVar3 == (FILE *)0x0) {
    GTestLog::GTestLog(&local_6c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest.cc"
                       ,0xc2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Unable to open file \"",0x15);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(output_file->_M_dataplus)._M_p,
                        output_file->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
    GTestLog::~GTestLog(&local_6c);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.pathname_._M_dataplus._M_p != &local_48.pathname_.field_2) {
    operator_delete(local_48.pathname_._M_dataplus._M_p,
                    local_48.pathname_.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  return (FILE *)pFVar3;
}

Assistant:

static FILE* OpenFileForWriting(const std::string& output_file) {
  FILE* fileout = nullptr;
  FilePath output_file_path(output_file);
  FilePath output_dir(output_file_path.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    fileout = posix::FOpen(output_file.c_str(), "w");
  }
  if (fileout == nullptr) {
    GTEST_LOG_(FATAL) << "Unable to open file \"" << output_file << "\"";
  }
  return fileout;
}